

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composite.cpp
# Opt level: O1

bool spvtools::opt::ExtInsMatch
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *extIndices,Instruction *insInst
               ,uint32_t extOffset)

{
  ulong uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  uVar2 = (uint32_t)
          ((ulong)((long)(extIndices->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(extIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        )._M_impl.super__Vector_impl_data._M_start) >> 2);
  uVar6 = uVar2 - extOffset;
  uVar5 = (insInst->has_result_id_ & 1) + 1;
  if (insInst->has_type_id_ == false) {
    uVar5 = (uint)insInst->has_result_id_;
  }
  if (uVar6 == ((int)((ulong)((long)(insInst->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(insInst->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
               uVar5) - 2) {
    bVar7 = uVar2 == extOffset;
    if (!bVar7) {
      uVar2 = (extIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start[extOffset];
      uVar5 = (insInst->has_result_id_ & 1) + 1;
      if (insInst->has_type_id_ == false) {
        uVar5 = (uint)insInst->has_result_id_;
      }
      uVar3 = Instruction::GetSingleWordOperand(insInst,uVar5 + 2);
      if (uVar2 == uVar3) {
        uVar1 = 1;
        do {
          uVar4 = uVar1;
          if (uVar6 == uVar4) break;
          uVar2 = (extIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start[extOffset + (int)uVar4];
          uVar5 = (insInst->has_result_id_ & 1) + 1;
          if (insInst->has_type_id_ == false) {
            uVar5 = (uint)insInst->has_result_id_;
          }
          uVar3 = Instruction::GetSingleWordOperand(insInst,uVar5 + (int)uVar4 + 2);
          uVar1 = uVar4 + 1;
        } while (uVar2 == uVar3);
        bVar7 = uVar6 <= uVar4;
      }
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool ExtInsMatch(const std::vector<uint32_t>& extIndices,
                 const Instruction* insInst, const uint32_t extOffset) {
  uint32_t numIndices = static_cast<uint32_t>(extIndices.size()) - extOffset;
  if (numIndices != insInst->NumInOperands() - 2) return false;
  for (uint32_t i = 0; i < numIndices; ++i)
    if (extIndices[i + extOffset] != insInst->GetSingleWordInOperand(i + 2))
      return false;
  return true;
}